

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gleam.cxx
# Opt level: O0

void frame_rect(int x,int y,int w,int h,Fl_Color fg1,Fl_Color fg2,Fl_Color lc)

{
  Fl_Color fg2_local;
  Fl_Color fg1_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  gleam_color(fg1);
  fl_yxline(x,y + h + -1,y + 1);
  fl_yxline(x + w,y + h + -1,y + 1);
  fl_xyline(x + 1,y,x + w + -1);
  fl_xyline(x + 1,y + h,x + w + -1);
  gleam_color(fg2);
  fl_yxline(x + 1,y + h + -2,y + 2);
  fl_yxline(x + w + -1,y + h + -2,y + 2);
  gleam_color(lc);
  fl_xyline(x + 2,y + 1,x + w + -3);
  fl_xyline(x + 2,y + h + -1,x + w + -3);
  return;
}

Assistant:

static void frame_rect(int x, int y, int w, int h, Fl_Color fg1, Fl_Color fg2, Fl_Color lc) {
  gleam_color(fg1);
  fl_yxline(x, y+h-1,  y+1);         //Go from bottom to top left side
  fl_yxline(x+w, y+h-1,  y+1);     //Go from bottom to top right side
  fl_xyline(x+1, y, x+w-1);         //Go across the top
  fl_xyline(x+1, y+h, x+w-1);     //Go across the bottom
  gleam_color(fg2);
  fl_yxline(x+1, y+h-2, y+2);     //Go from bottom to top left side
  fl_yxline(x+w-1, y+h-2, y+2); //Go from bottom to top right side
  gleam_color(lc);
  fl_xyline(x+2, y+1, x+w-3);     //Go across the top
  fl_xyline(x+2, y+h-1, x+w-3); //Go across the bottom
}